

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

void emit_code(FILE *out,rule *rp,lemon *lemp,int *lineno)

{
  char *local_30;
  char *cp;
  int *lineno_local;
  lemon *lemp_local;
  rule *rp_local;
  FILE *out_local;
  
  if ((rp->codePrefix != (char *)0x0) && (*rp->codePrefix != '\0')) {
    fprintf((FILE *)out,"{%s",rp->codePrefix);
    for (local_30 = rp->codePrefix; *local_30 != '\0'; local_30 = local_30 + 1) {
      if (*local_30 == '\n') {
        *lineno = *lineno + 1;
      }
    }
  }
  if (rp->code != (char *)0x0) {
    if (lemp->nolinenosflag == 0) {
      *lineno = *lineno + 1;
      tplt_linedir(out,rp->line,lemp->filename);
    }
    fprintf((FILE *)out,"{%s",rp->code);
    for (local_30 = rp->code; *local_30 != '\0'; local_30 = local_30 + 1) {
      if (*local_30 == '\n') {
        *lineno = *lineno + 1;
      }
    }
    fprintf((FILE *)out,"}\n");
    *lineno = *lineno + 1;
  }
  if ((rp->codeSuffix != (char *)0x0) && (*rp->codeSuffix != '\0')) {
    fprintf((FILE *)out,"%s",rp->codeSuffix);
    for (local_30 = rp->codeSuffix; *local_30 != '\0'; local_30 = local_30 + 1) {
      if (*local_30 == '\n') {
        *lineno = *lineno + 1;
      }
    }
  }
  if (rp->codePrefix != (char *)0x0) {
    fprintf((FILE *)out,"}\n");
    *lineno = *lineno + 1;
  }
  return;
}

Assistant:

PRIVATE void emit_code(
  FILE *out,
  struct rule *rp,
  struct lemon *lemp,
  int *lineno
){
 const char *cp;

 /* Setup code prior to the #line directive */
 if( rp->codePrefix && rp->codePrefix[0] ){
   fprintf(out, "{%s", rp->codePrefix);
   for(cp=rp->codePrefix; *cp; cp++){ if( *cp=='\n' ) (*lineno)++; }
 }

 /* Generate code to do the reduce action */
 if( rp->code ){
   if( !lemp->nolinenosflag ){
     (*lineno)++;
     tplt_linedir(out,rp->line,lemp->filename);
   }
   fprintf(out,"{%s",rp->code);
   for(cp=rp->code; *cp; cp++){ if( *cp=='\n' ) (*lineno)++; }
   fprintf(out,"}\n"); (*lineno)++;
   /*if( !lemp->nolinenosflag ){
     (*lineno)++;
     tplt_linedir(out,*lineno,lemp->outname);
   }*/
 }

 /* Generate breakdown code that occurs after the #line directive */
 if( rp->codeSuffix && rp->codeSuffix[0] ){
   fprintf(out, "%s", rp->codeSuffix);
   for(cp=rp->codeSuffix; *cp; cp++){ if( *cp=='\n' ) (*lineno)++; }
 }

 if( rp->codePrefix ){
   fprintf(out, "}\n"); (*lineno)++;
 }

 return;
}